

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StandardCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StandardCaseItemSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args,
          Token *args_1,SyntaxNode *args_2)

{
  Token colon;
  StandardCaseItemSyntax *this_00;
  
  this_00 = (StandardCaseItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StandardCaseItemSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (StandardCaseItemSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  colon.kind = args_1->kind;
  colon._2_1_ = args_1->field_0x2;
  colon.numFlags.raw = (args_1->numFlags).raw;
  colon.rawLen = args_1->rawLen;
  colon.info = args_1->info;
  slang::syntax::StandardCaseItemSyntax::StandardCaseItemSyntax(this_00,args,colon,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }